

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O2

bool google::protobuf::internal::GetAnyFieldDescriptors
               (Message *message,FieldDescriptor **type_url_field,FieldDescriptor **value_field)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  undefined4 extraout_var;
  FieldDescriptor *pFVar4;
  Descriptor *this;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])();
  this = (Descriptor *)CONCAT44(extraout_var,iVar2);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)(this + 8) + 0x20),"google.protobuf.Any");
  if (!bVar1) {
    pFVar4 = Descriptor::FindFieldByNumber(this,1);
    *type_url_field = pFVar4;
    pFVar4 = Descriptor::FindFieldByNumber(this,2);
    *value_field = pFVar4;
    if (((*type_url_field != (FieldDescriptor *)0x0) &&
        (TVar3 = FieldDescriptor::type(*type_url_field), TVar3 == TYPE_STRING)) &&
       (*value_field != (FieldDescriptor *)0x0)) {
      TVar3 = FieldDescriptor::type(*value_field);
      return TVar3 == TYPE_BYTES;
    }
  }
  return false;
}

Assistant:

bool GetAnyFieldDescriptors(const Message& message,
                            const FieldDescriptor** type_url_field,
                            const FieldDescriptor** value_field) {
  const Descriptor* descriptor = message.GetDescriptor();
  if (descriptor->full_name() != kAnyFullTypeName) {
    return false;
  }
  *type_url_field = descriptor->FindFieldByNumber(1);
  *value_field = descriptor->FindFieldByNumber(2);
  return (*type_url_field != nullptr &&
          (*type_url_field)->type() == FieldDescriptor::TYPE_STRING &&
          *value_field != nullptr &&
          (*value_field)->type() == FieldDescriptor::TYPE_BYTES);
}